

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

ITexture * __thiscall
irr::video::CNullDriver::addTexture(CNullDriver *this,path *name,IImage *image)

{
  bool bVar1;
  u32 uVar2;
  int iVar3;
  undefined4 extraout_var;
  CNullDriver *in_RDX;
  undefined8 in_RSI;
  CNullDriver *in_RDI;
  double __x;
  ITexture *t;
  IReferenceCounted *in_stack_ffffffffffffffc8;
  ITexture *local_8;
  
  uVar2 = core::string<char>::size((string<char> *)0x3098d7);
  if (uVar2 == 0) {
    os::Printer::log((Printer *)"Could not create ITexture, texture needs to have a non-empty name."
                     ,__x);
    local_8 = (ITexture *)0x0;
  }
  else if (in_RDX == (CNullDriver *)0x0) {
    local_8 = (ITexture *)0x0;
  }
  else {
    local_8 = (ITexture *)0x0;
    bVar1 = checkImage(in_RDI,(IImage *)in_RDX);
    if (bVar1) {
      iVar3 = (*(in_RDI->super_IVideoDriver)._vptr_IVideoDriver[0x75])(in_RDI,in_RSI,in_RDX);
      local_8 = (ITexture *)CONCAT44(extraout_var,iVar3);
    }
    if (local_8 != (ITexture *)0x0) {
      addTexture(in_RDX,local_8);
      IReferenceCounted::drop(in_stack_ffffffffffffffc8);
    }
  }
  return local_8;
}

Assistant:

ITexture *CNullDriver::addTexture(const io::path &name, IImage *image)
{
	if (0 == name.size()) {
		os::Printer::log("Could not create ITexture, texture needs to have a non-empty name.", ELL_WARNING);
		return 0;
	}

	if (!image)
		return 0;

	ITexture *t = 0;

	if (checkImage(image)) {
		t = createDeviceDependentTexture(name, image);
	}

	if (t) {
		addTexture(t);
		t->drop();
	}

	return t;
}